

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_multiple_outputs0(APITests *this)

{
  initializer_list<int> __l;
  allocator_type local_29;
  vector<int,_std::allocator<int>_> channels;
  int local_10;
  int local_c;
  
  GPIO::setmode(BOARD);
  local_10 = (this->pin_data).out_a;
  local_c = (this->pin_data).out_b;
  __l._M_len = 2;
  __l._M_array = &local_10;
  std::vector<int,_std::allocator<int>_>::vector(&channels,__l,&local_29);
  GPIO::setup((vector *)&channels,OUT,-1);
  GPIO::output((vector *)&channels,1);
  GPIO::output((vector *)&channels,0);
  GPIO::cleanup();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&channels.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_multiple_outputs0()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, GPIO::HIGH);
        GPIO::output(channels, GPIO::LOW);
        GPIO::cleanup();
    }